

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-conv.c
# Opt level: O2

char * conv_path_to_utf8_with_tmpl
                 (GString *path,char *from_enc,out_fmt fmt_type,StrTransformFunc func,GError **error
                 )

{
  byte bVar1;
  GError *pGVar2;
  gchar *pgVar3;
  gsize gVar4;
  char **ppcVar5;
  GError **ppGVar6;
  GQuark GVar7;
  int iVar8;
  int iVar9;
  size_t sVar10;
  GString *str;
  undefined8 uVar11;
  long lVar12;
  int *piVar13;
  undefined8 uVar14;
  long *plVar15;
  gchar *pgVar16;
  ushort uVar17;
  char *pcVar18;
  size_t i;
  gsize gVar19;
  ulong uVar20;
  long lVar21;
  byte *__s;
  size_t local_88;
  gsize o_left;
  char **local_78;
  char *i_ptr;
  StrTransformFunc local_68;
  GError **local_60;
  char *local_58;
  size_t local_50;
  long local_48;
  char *o_ptr;
  size_t local_38;
  
  if (path == (GString *)0x0) {
    pcVar18 = "path != NULL";
  }
  else {
    if (from_enc == (char *)0x0) {
      pcVar18 = path->str;
      local_68 = func;
      local_60 = error;
      local_58 = from_enc;
      sVar10 = ucs2_bytelen(pcVar18,path->len);
      local_50 = 2;
      from_enc = "UTF-16LE";
    }
    else {
      if (*from_enc == '\0') {
        pcVar18 = "! from_enc || *from_enc";
        goto LAB_00106186;
      }
      pcVar18 = path->str;
      local_68 = func;
      local_60 = error;
      sVar10 = strnlen(pcVar18,0x104);
      local_50 = 1;
      local_58 = from_enc;
    }
    local_88 = sVar10;
    i_ptr = pcVar18;
    str = (GString *)g_string_sized_new(sVar10 + 1);
    gVar19 = ~str->len + str->allocated_len;
    o_ptr = str->str + str->len;
    o_left = gVar19;
    uVar11 = g_iconv_open("UTF-8",from_enc);
    g_log("rifiuti2",0x80,"Initial : r=%02zu, w=%02zu/%02zu",sVar10,gVar19,str->allocated_len - 1);
    local_78 = (char **)g_ptr_array_new_with_free_func(g_free);
    local_48 = (long)fmt_type;
    local_38 = sVar10;
    while (sVar10 != 0) {
      if ((*i_ptr == '\0') && ((local_58 != (char *)0x0 || (i_ptr[1] == '\0')))) goto LAB_001060a1;
      lVar12 = g_iconv(uVar11,&i_ptr,&local_88,&o_ptr,&o_left);
      _sync_pos(str,&o_left,&o_ptr,false);
      sVar10 = local_88;
      if (lVar12 != -1) goto LAB_001060a5;
      piVar13 = __errno_location();
      gVar4 = o_left;
      iVar8 = *piVar13;
      gVar19 = str->allocated_len;
      uVar14 = g_strerror(iVar8);
      g_log("rifiuti2",0x80,"Progress: r=%02zu, w=%02zu/%02zu, status=%zd (%s), str=%s",sVar10,gVar4
            ,gVar19 - 1,0xffffffffffffffff,uVar14,str->str);
      if (iVar8 == 7) {
        str = (GString *)g_string_set_size(str,str->allocated_len * 2);
        o_left = ~str->len + str->allocated_len;
        o_ptr = str->str + str->len;
        sVar10 = local_88;
      }
      else if ((iVar8 == 0x54) || (sVar10 = local_88, iVar8 == 0x16)) {
        plVar15 = (long *)g_malloc(8);
        *plVar15 = local_38 - local_88;
        g_ptr_array_add(local_78,plVar15);
        if (local_88 == 0) {
          pcVar18 = "*bytes_left > 0";
LAB_00106095:
          g_return_if_fail_warning("rifiuti2","_advance_octet",pcVar18);
        }
        else {
          if (i_ptr == (char *)0x0) {
            pcVar18 = "*ptr != NULL";
            goto LAB_00106095;
          }
          sVar10 = local_88;
          if (local_88 != 1) {
            sVar10 = local_50;
          }
          if (sVar10 == 1) {
            uVar17 = (ushort)(byte)*i_ptr;
          }
          else {
            uVar17 = *(ushort *)i_ptr;
          }
          g_string_append_printf
                    (str,*(undefined8 *)(local_48 * 0x38 + 0x10b408 + sVar10 * 8),uVar17);
          i_ptr = i_ptr + sVar10;
          local_88 = local_88 - sVar10;
        }
        o_left = ~str->len + str->allocated_len;
        o_ptr = str->str + str->len;
        g_log("rifiuti2",0x80,"Progress: r=%02zu, w=%02zu/%02zu, str=%s",local_88,o_left,
              str->allocated_len - 1,str->str);
        g_iconv(uVar11,0,0,&o_ptr,&o_left);
        _sync_pos(str,&o_left,&o_ptr,false);
        sVar10 = local_88;
      }
    }
    sVar10 = 0;
LAB_001060a1:
    lVar12 = -1;
LAB_001060a5:
    g_log("rifiuti2",0x80,"Finally : r=%02zu, w=%02zu/%02zu, status=%zd, str=%s",sVar10,o_left,
          str->allocated_len - 1,lVar12);
    g_iconv_close(uVar11);
    ppGVar6 = local_60;
    ppcVar5 = local_78;
    if (local_60 != (GError **)0x0) {
      pGVar2 = *local_60;
      GVar7 = rifiuti_record_error_quark();
      iVar8 = g_error_matches(pGVar2,GVar7,3);
      if ((iVar8 != 0) && (*(int *)(ppcVar5 + 1) != 0)) {
        pgVar3 = (*ppGVar6)->message;
        uVar11 = g_string_new();
        uVar11 = g_string_append(uVar11,", at offset:");
        for (uVar20 = 0; uVar20 < *(uint *)(ppcVar5 + 1); uVar20 = uVar20 + 1) {
          g_string_append_printf(uVar11," %zu",**(undefined8 **)(*ppcVar5 + uVar20 * 8));
        }
        pgVar16 = (gchar *)g_string_free(uVar11,0);
        (*ppGVar6)->message = pgVar16;
        g_free(pgVar3);
      }
    }
    g_ptr_array_free(ppcVar5,1);
    iVar8 = g_utf8_validate(str->str,0xffffffffffffffff,0);
    if (iVar8 != 0) {
      __s = (byte *)str->str;
      if (local_68 == (StrTransformFunc)0x0) {
        sVar10 = strlen((char *)__s);
        uVar11 = g_string_sized_new(sVar10 * 2);
        lVar12 = _g_utf8_skip;
        local_78 = fmt[local_48].fallback_tmpl;
        while (bVar1 = *__s, (ulong)bVar1 != 0) {
          iVar8 = g_utf8_get_char(__s);
          lVar21 = (long)*(char *)(lVar12 + (ulong)bVar1);
          iVar9 = g_unichar_isgraph(iVar8);
          if ((iVar8 == 0x20) || (iVar9 != 0)) {
            uVar11 = g_string_append_len(uVar11,__s,lVar21);
            __s = __s + lVar21;
          }
          else {
            g_string_append_printf(uVar11,*local_78,iVar8);
            __s = __s + lVar21;
          }
        }
        pcVar18 = (char *)g_string_free(uVar11,0);
      }
      else {
        pcVar18 = (*local_68)((char *)__s);
      }
      g_string_free(str,1);
      return pcVar18;
    }
    pcVar18 = "g_utf8_validate (s->str, -1, NULL)";
  }
LAB_00106186:
  g_return_if_fail_warning("rifiuti2","conv_path_to_utf8_with_tmpl",pcVar18);
  return (char *)0x0;
}

Assistant:

char *
conv_path_to_utf8_with_tmpl (const GString   *path,
                             const char      *from_enc,
                             out_fmt          fmt_type,
                             StrTransformFunc func,
                             GError         **error)
{
    char            *i_ptr,
                    *o_ptr,
                    *result;
    gsize            i_size,
                     i_left,
                     o_left,
                     char_sz,
                     status;
    GIConv           conv;
    GPtrArray       *err_offsets;
    GString         *s;

    // For unicode path, the first char must be ASCII drive letter
    // or slash. And since it is in little endian, first byte is
    // always non-null
    g_return_val_if_fail (path != NULL, NULL);
    g_return_val_if_fail (! from_enc || *from_enc, NULL);

    if (from_enc)
    {
        char_sz = sizeof (char);
        i_left = i_size = strnlen (path->str, WIN_PATH_MAX);
    }
    else
    {
        char_sz = sizeof (gunichar2);
        i_left = i_size = ucs2_bytelen (path->str, path->len);
    }
    i_ptr = path->str;

    // Ballpark figure, GString decides alloc size on its own
    s = g_string_sized_new (i_size + 1);
    _sync_pos (s, &o_left, &o_ptr, true);

    // Shouldn't fail, encoding already tested upon start of prog
    conv = g_iconv_open ("UTF-8", from_enc ? from_enc : "UTF-16LE");

    g_debug ("Initial : r=%02zu, w=%02zu/%02zu",
        i_left, o_left, s->allocated_len - 1);
    err_offsets = g_ptr_array_new_with_free_func ((GDestroyNotify) g_free);

    // Pass 1: Convert to UTF-8, all illegal seq become escaped hex

    while (i_left > 0)
    {
        if (*i_ptr == '\0') {
            if (from_enc   != NULL) break;
            if (*(i_ptr+1) == '\0') break; /* utf-16: check "\0\0" */
        }

        // When non-reversible char are converted to \uFFFD, there
        // is nothing we can do. Just accept the status quo.
        status = g_iconv (conv, &i_ptr, &i_left, &o_ptr, &o_left);
        _sync_pos (s, &o_left, &o_ptr, false);
        if (status != (gsize) -1)
            break;

        int e = errno;
        g_debug ("Progress: r=%02zu, w=%02zu/%02zu, status=%zd (%s), str=%s",
            i_left, o_left, s->allocated_len - 1,
            status, g_strerror(e), s->str);

        switch (e)
        {
        case EINVAL:
        case EILSEQ:
        {
            size_t *processed = g_malloc (sizeof (size_t));
            *processed = i_size - i_left;
            g_ptr_array_add (err_offsets, processed);
        }
            _advance_octet (char_sz, &i_ptr, &i_left, s, fmt_type);
            _sync_pos (s, &o_left, &o_ptr, true);
            g_debug ("Progress: r=%02zu, w=%02zu/%02zu, str=%s",
                i_left, o_left, s->allocated_len - 1, s->str);
            g_iconv (conv, NULL, NULL, &o_ptr, &o_left);  // reset state
            _sync_pos (s, &o_left, &o_ptr, false);
            break;
        case E2BIG:
            s = g_string_set_size (s, s->allocated_len * 2);
            _sync_pos (s, &o_left, &o_ptr, true);
            break;
        }
    }

    g_debug ("Finally : r=%02zu, w=%02zu/%02zu, status=%zd, str=%s",
        i_left, o_left, s->allocated_len - 1, status, s->str);

    g_iconv_close (conv);

    if (error &&
        g_error_matches ((const GError *) (*error),
            R2_REC_ERROR, R2_REC_ERROR_CONV_PATH) &&
        err_offsets->len > 0)
    {
        // More detailed error message showing offsets
        char *old = (*error)->message;
        GString *dbg_str = g_string_new ((const char *) old);
        dbg_str = g_string_append (dbg_str, ", at offset:");
        for (size_t i = 0; i < err_offsets->len; i++)
        {
            g_string_append_printf (dbg_str, " %zu",
                *((size_t *) (err_offsets->pdata[i])));
        }
        (*error)->message = g_string_free (dbg_str, FALSE);
        g_free (old);
    }

    g_ptr_array_free (err_offsets, TRUE);

    // Pass 2: Post processing, e.g. convert non-printable chars to hex

    g_return_val_if_fail (g_utf8_validate (s->str, -1, NULL), NULL);

    if (func == NULL)
        result = _filter_printable_char (s->str, fmt_type);
    else
        result = func (s->str);
    g_string_free (s, TRUE);

    return result;
}